

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

int __thiscall QNativeSocketEngine::close(QNativeSocketEngine *this,int __fd)

{
  QNativeSocketEnginePrivate *this_00;
  int extraout_EAX;
  int iVar1;
  
  this_00 = *(QNativeSocketEnginePrivate **)(this + 8);
  if (this_00->readNotifier != (QSocketNotifier *)0x0) {
    QSocketNotifier::setEnabled(SUB81(this_00->readNotifier,0));
  }
  if (this_00->writeNotifier != (QSocketNotifier *)0x0) {
    QSocketNotifier::setEnabled(SUB81(this_00->writeNotifier,0));
  }
  if (this_00->exceptNotifier != (QSocketNotifier *)0x0) {
    QSocketNotifier::setEnabled(SUB81(this_00->exceptNotifier,0));
  }
  if (this_00->socketDescriptor != -1) {
    QNativeSocketEnginePrivate::nativeClose(this_00);
    this_00->socketDescriptor = -1;
  }
  (this_00->super_QAbstractSocketEnginePrivate).socketState = UnconnectedState;
  (this_00->super_QAbstractSocketEnginePrivate).hasSetSocketError = false;
  (this_00->super_QAbstractSocketEnginePrivate).localPort = 0;
  QHostAddress::clear(&(this_00->super_QAbstractSocketEnginePrivate).localAddress);
  (this_00->super_QAbstractSocketEnginePrivate).peerPort = 0;
  QHostAddress::clear(&(this_00->super_QAbstractSocketEnginePrivate).peerAddress);
  (this_00->super_QAbstractSocketEnginePrivate).inboundStreamCount = 0;
  (this_00->super_QAbstractSocketEnginePrivate).outboundStreamCount = 0;
  iVar1 = extraout_EAX;
  if (this_00->readNotifier != (QSocketNotifier *)0x0) {
    iVar1 = (**(code **)(*(long *)this_00->readNotifier + 0x20))();
    this_00->readNotifier = (QSocketNotifier *)0x0;
  }
  if (this_00->writeNotifier != (QSocketNotifier *)0x0) {
    iVar1 = (**(code **)(*(long *)this_00->writeNotifier + 0x20))();
    this_00->writeNotifier = (QSocketNotifier *)0x0;
  }
  if (this_00->exceptNotifier != (QSocketNotifier *)0x0) {
    iVar1 = (**(code **)(*(long *)this_00->exceptNotifier + 0x20))();
    this_00->exceptNotifier = (QSocketNotifier *)0x0;
  }
  return iVar1;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }